

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void ecs_map_grow(ecs_map_t *map,int32_t element_count)

{
  int32_t bucket_count;
  
  _ecs_assert(map != (ecs_map_t *)0x0,2,(char *)0x0,"map != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x1d0);
  if (map == (ecs_map_t *)0x0) {
    __assert_fail("map != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0x1d0,"void ecs_map_grow(ecs_map_t *, int32_t)");
  }
  bucket_count = ecs_next_pow_of_2((int)((float)(element_count + map->count) * 1.5));
  if (map->bucket_count < bucket_count) {
    rehash(map,bucket_count);
    return;
  }
  return;
}

Assistant:

void ecs_map_grow(
    ecs_map_t *map, 
    int32_t element_count)
{
    ecs_assert(map != NULL, ECS_INVALID_PARAMETER, NULL);
    int32_t target_count = map->count + element_count;
    int32_t bucket_count = get_bucket_count(target_count);

    if (bucket_count > map->bucket_count) {
        rehash(map, bucket_count);
    }
}